

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic.c++
# Opt level: O0

Maybe<capnp::EnumSchema::Enumerant> * __thiscall
capnp::DynamicEnum::getEnumerant
          (Maybe<capnp::EnumSchema::Enumerant> *__return_storage_ptr__,DynamicEnum *this)

{
  ushort uVar1;
  uint uVar2;
  Enumerant local_90;
  undefined1 local_50 [8];
  EnumerantList enumerants;
  DynamicEnum *this_local;
  
  enumerants.list.reader._40_8_ = this;
  EnumSchema::getEnumerants((EnumerantList *)local_50,&this->schema);
  uVar1 = this->value;
  uVar2 = EnumSchema::EnumerantList::size((EnumerantList *)local_50);
  if (uVar1 < uVar2) {
    EnumSchema::EnumerantList::operator[](&local_90,(EnumerantList *)local_50,(uint)this->value);
    kj::Maybe<capnp::EnumSchema::Enumerant>::Maybe(__return_storage_ptr__,&local_90);
  }
  else {
    kj::Maybe<capnp::EnumSchema::Enumerant>::Maybe(__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

kj::Maybe<EnumSchema::Enumerant> DynamicEnum::getEnumerant() const {
  auto enumerants = schema.getEnumerants();
  if (value < enumerants.size()) {
    return enumerants[value];
  } else {
    return kj::none;
  }
}